

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevent_p.h
# Opt level: O2

QMouseEvent * __thiscall
QEventStorage<QMouseEvent>::store(QEventStorage<QMouseEvent> *this,QMouseEvent *e)

{
  if (this->m_engaged == true) {
    disengage(this);
  }
  engage(this,e);
  return (QMouseEvent *)this;
}

Assistant:

Event &store(const Event &e)
    {
        if (m_engaged)
            disengage();
        engage(e);
        return m_event;
    }